

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

int __thiscall bdQuery::addClosestPeer(bdQuery *this,bdId *id,uint32_t mode)

{
  _Rb_tree_header *p_Var1;
  multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  *this_00;
  uint *puVar2;
  in_port_t iVar3;
  in_addr iVar4;
  int iVar5;
  int iVar6;
  _Self __tmp;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  iterator iVar10;
  long lVar11;
  _Self __tmp_1;
  bdId *pbVar12;
  bdPeer *pbVar13;
  _Self __tmp_2;
  _Rb_tree_node_base *p_Var14;
  int iVar15;
  byte bVar16;
  bdMetric dist;
  bdNodeId local_fc;
  bdId local_e8;
  uint32_t local_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  pair<bdMetric,_bdPeer> local_98;
  
  bVar16 = 0;
  p_Var7 = (_Base_ptr)time((time_t *)0x0);
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&id->id,&local_fc);
  p_Var8 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->mClosest)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = &p_Var1->_M_header;
  if (p_Var8 != (_Rb_tree_node_base *)0x0) {
    do {
      iVar5 = operator<((bdNodeId *)(p_Var8 + 1),&local_fc);
      if (iVar5 == 0) {
        p_Var9 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[iVar5 != 0];
    } while (p_Var8 != (_Base_ptr)0x0);
  }
  p_Var8 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var1->_M_header;
  if (p_Var8 != (_Rb_tree_node_base *)0x0) {
    do {
      iVar5 = operator<(&local_fc,(bdNodeId *)(p_Var8 + 1));
      if (iVar5 != 0) {
        p_Var14 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[iVar5 == 0];
    } while (p_Var8 != (_Base_ptr)0x0);
  }
  p_Var8 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar15 = 0;
  iVar5 = 0;
  if (p_Var8 != p_Var14) {
    iVar5 = 0;
    iVar15 = 0;
    do {
      lVar11 = *(long *)(p_Var8 + 3);
      if ((lVar11 != 0) && (10 < (long)p_Var7 - lVar11 && (long)p_Var8[3]._M_parent < lVar11)) {
        iVar5 = iVar5 + -1;
        iVar15 = iVar15 + 1;
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      iVar5 = iVar5 + 1;
    } while (p_Var8 != p_Var14);
  }
  iVar6 = 0;
  if (iVar5 < this->mClosestListSize) {
    for (; p_Var9 != p_Var14; p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      iVar5 = (*this->mFns->_vptr_bdDhtFunctions[7])(this->mFns,id,&p_Var9[1]._M_right);
      if ((char)iVar5 != '\0') {
        if ((mode != 0) &&
           (iVar5 = (*this->mFns->_vptr_bdDhtFunctions[8])(this->mFns,&p_Var9[1]._M_right,id),
           (char)iVar5 != '\0')) {
          *(byte *)&p_Var9[3]._M_right = *(byte *)&p_Var9[3]._M_right | 1;
        }
        if ((mode & 4) == 0) {
          return 1;
        }
        p_Var9[3]._M_parent = p_Var7;
        puVar2 = (uint *)((long)&p_Var9[2]._M_right + 4);
        *puVar2 = *puVar2 | mode;
        return 1;
      }
    }
    this_00 = &this->mClosest;
    if (0 < iVar15) {
      iVar5 = 0;
      do {
        for (iVar10._M_node = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)iVar10._M_node != p_Var1;
            iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node)) {
          lVar11 = *(long *)(iVar10._M_node + 3);
          if ((lVar11 != 0) &&
             (10 < (long)p_Var7 - lVar11 && (long)iVar10._M_node[3]._M_parent < lVar11)) {
            std::
            _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
            ::erase_abi_cxx11_((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                                *)this_00,iVar10);
            break;
          }
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != iVar15);
    }
    while ((ulong)(this->mClosestListSize - 1) <
           (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      iVar10._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      std::
      _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
      ::erase_abi_cxx11_((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                          *)this_00,iVar10);
    }
    bdId::bdId(&local_e8);
    uStack_a8 = 0;
    local_e8.addr.sin_family = (id->addr).sin_family;
    local_e8.addr.sin_port = (id->addr).sin_port;
    local_e8.addr.sin_addr.s_addr = (id->addr).sin_addr.s_addr;
    local_e8.addr.sin_zero = *&(id->addr).sin_zero;
    local_e8.id.data._0_8_ = *(undefined8 *)(id->id).data;
    local_e8.id.data._8_8_ = *(undefined8 *)((id->id).data + 8);
    local_e8.id.data._16_4_ = *(undefined4 *)((id->id).data + 0x10);
    local_c4 = mode;
    uStack_c0 = 0;
    uStack_bc = 0;
    uStack_b8 = 0;
    uStack_b4 = 0;
    uStack_b0 = SUB84(p_Var7,0);
    uStack_ac = (undefined4)((ulong)p_Var7 >> 0x20);
    if ((mode & 4) != 0) {
      uStack_b8 = uStack_b0;
      uStack_b4 = uStack_ac;
    }
    local_98.first.super_bdNodeId.data[0x10] = local_fc.data[0x10];
    local_98.first.super_bdNodeId.data[0x11] = local_fc.data[0x11];
    local_98.first.super_bdNodeId.data[0x12] = local_fc.data[0x12];
    local_98.first.super_bdNodeId.data[0x13] = local_fc.data[0x13];
    local_98.first.super_bdNodeId.data[0] = local_fc.data[0];
    local_98.first.super_bdNodeId.data[1] = local_fc.data[1];
    local_98.first.super_bdNodeId.data[2] = local_fc.data[2];
    local_98.first.super_bdNodeId.data[3] = local_fc.data[3];
    local_98.first.super_bdNodeId.data[4] = local_fc.data[4];
    local_98.first.super_bdNodeId.data[5] = local_fc.data[5];
    local_98.first.super_bdNodeId.data[6] = local_fc.data[6];
    local_98.first.super_bdNodeId.data[7] = local_fc.data[7];
    local_98.first.super_bdNodeId.data[8] = local_fc.data[8];
    local_98.first.super_bdNodeId.data[9] = local_fc.data[9];
    local_98.first.super_bdNodeId.data[10] = local_fc.data[10];
    local_98.first.super_bdNodeId.data[0xb] = local_fc.data[0xb];
    local_98.first.super_bdNodeId.data[0xc] = local_fc.data[0xc];
    local_98.first.super_bdNodeId.data[0xd] = local_fc.data[0xd];
    local_98.first.super_bdNodeId.data[0xe] = local_fc.data[0xe];
    local_98.first.super_bdNodeId.data[0xf] = local_fc.data[0xf];
    pbVar12 = &local_e8;
    pbVar13 = &local_98.second;
    for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
      iVar3 = (pbVar12->addr).sin_port;
      iVar4.s_addr = (pbVar12->addr).sin_addr.s_addr;
      (pbVar13->mPeerId).addr.sin_family = (pbVar12->addr).sin_family;
      (pbVar13->mPeerId).addr.sin_port = iVar3;
      (pbVar13->mPeerId).addr.sin_addr = (in_addr)iVar4.s_addr;
      pbVar12 = (bdId *)((long)pbVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      pbVar13 = (bdPeer *)((long)pbVar13 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    std::
    _Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
    ::_M_emplace_equal<std::pair<bdMetric,bdPeer>>
              ((_Rb_tree<bdMetric,std::pair<bdMetric_const,bdPeer>,std::_Select1st<std::pair<bdMetric_const,bdPeer>>,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                *)this_00,&local_98);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int bdQuery::addClosestPeer(const bdId *id, uint32_t mode) {
	bdMetric dist;
	time_t ts = time(NULL);

	mFns->bdDistance(&mId, &(id->id), &dist);

#ifdef DEBUG_QUERY 
        fprintf(stderr, "bdQuery::addPeer(");
	mFns->bdPrintId(std::cerr, id);
        fprintf(stderr, ", %u)\n", mode);
#endif

	std::multimap<bdMetric, bdPeer>::iterator it, sit, eit;
	sit = mClosest.lower_bound(dist);
	eit = mClosest.upper_bound(dist);
	int i = 0;
	int actualCloser = 0;
	int toDrop = 0;
	// switched end condition to upper_bound to provide stability for NATTED peers.
	// we will favour the older entries!
	for (it = mClosest.begin(); it != eit; it++, i++, actualCloser++) {
		time_t sendts = ts - it->second.mLastSendTime;
		bool hasSent = (it->second.mLastSendTime != 0);
		bool hasReply = (it->second.mLastRecvTime >= it->second.mLastSendTime);
		if ((hasSent) && (!hasReply) && (sendts > EXPECTED_REPLY)) {
			i--; /* dont count this one */
			toDrop++;
		}
	}
		// Counts where we are.
#ifdef DEBUG_QUERY 
        fprintf(stderr, "Searching.... %di = %d - %d peers closer than this one\n", i, actualCloser, toDrop);
#endif


	if (i > mClosestListSize - 1) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "Distance to far... dropping\n");
#endif
		/* drop it */
		return 0;
	}

	for (it = sit; it != eit; it++, i++) {
		/* full id check */
		if (mFns->bdSimilarId(id, &(it->second.mPeerId))) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "Peer Already here!\n");
#endif
			if (mode) {
				/* also update port from incoming id, as we have definitely recved from it */
				if (mFns->bdUpdateSimilarId(&(it->second.mPeerId), id))
					/* updated it... must be Unstable */
					it->second.mExtraFlags |= BITDHT_PEER_EXFLAG_UNSTABLE;
			}
			if (mode & BITDHT_PEER_STATUS_RECV_NODES) {
				/* only update recvTime if sendTime > checkTime.... (then its our query) */
#ifdef DEBUG_QUERY 
				fprintf(stderr, "Updating LastRecvTime\n");
#endif
				it->second.mLastRecvTime = ts;
				it->second.mPeerFlags |= mode;
			}
			return 1;
		}
	}

#ifdef DEBUG_QUERY 
        fprintf(stderr, "Peer not in Query\n");
#endif
	/* firstly drop unresponded (bit ugly - but hard structure to extract from) */
	for (int j = 0; j < toDrop; j++) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "Dropping Peer that dont reply\n");
#endif
		for (it = mClosest.begin(); it != mClosest.end(); ++it) {
			time_t sendts = ts - it->second.mLastSendTime;
			bool hasSent = (it->second.mLastSendTime != 0);
			bool hasReply = (it->second.mLastRecvTime >= it->second.mLastSendTime);

			if ((hasSent) && (!hasReply) && (sendts > EXPECTED_REPLY)) {
#ifdef DEBUG_QUERY 
        			fprintf(stderr, "Dropped: ");
				mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
        			fprintf(stderr, "\n");
#endif
				mClosest.erase(it);
				break ;
			}
		}
	}

	/* trim it back */
	while (mClosest.size() > (uint32_t) (mClosestListSize - 1)) {
		std::multimap<bdMetric, bdPeer>::iterator it;
		it = mClosest.end();
		if (!mClosest.empty()) {
			it--;
#ifdef DEBUG_QUERY 
			fprintf(stderr, "Removing Furthest Peer: ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			fprintf(stderr, "\n");
#endif

			mClosest.erase(it);
		}
	}

#ifdef DEBUG_QUERY 
        fprintf(stderr, "bdQuery::addPeer(): Closer Peer!: ");
	mFns->bdPrintId(std::cerr, id);
        fprintf(stderr, "\n");
#endif

	/* add it in */
	bdPeer peer;
	peer.mPeerId = *id;
	peer.mPeerFlags = mode;
	peer.mLastSendTime = 0;
	peer.mLastRecvTime = 0;
	peer.mFoundTime = ts;

	if (mode & BITDHT_PEER_STATUS_RECV_NODES)
		peer.mLastRecvTime = ts;

	mClosest.insert(std::pair<bdMetric, bdPeer>(dist, peer));
	return 1;
}